

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::MessageBuilder::MessageBuilder
          (MessageBuilder *this,char *file,int line,Enum severity)

{
  ostream *poVar1;
  
  (this->super_MessageData).m_string.field_0.buf[0] = '\0';
  (this->super_MessageData).m_string.field_0.buf[0x17] = '\x17';
  poVar1 = getTlsOss();
  this->m_stream = poVar1;
  (this->super_MessageData).m_file = file;
  (this->super_MessageData).m_line = line;
  (this->super_MessageData).m_severity = severity;
  return;
}

Assistant:

MessageBuilder::MessageBuilder(const char* file, int line, assertType::Enum severity) {
        m_stream   = getTlsOss();
        m_file     = file;
        m_line     = line;
        m_severity = severity;
    }